

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O3

natwm_error color_value_from_config(map *map,char *key,color_value **result)

{
  natwm_error nVar1;
  char *fmt;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar2;
  char *local_30;
  char *string;
  color_value *value;
  
  uVar2 = 0x1044d0;
  local_30 = (char *)0x0;
  nVar1 = config_find_string(map,key,&local_30);
  if (nVar1 == NO_ERROR) {
    string = (char *)0x0;
    nVar1 = color_value_from_string(local_30,(color_value **)&string);
    if (nVar1 == NO_ERROR) {
      *result = (color_value *)string;
      return NO_ERROR;
    }
    fmt = "Failed to retrieve color value from \'%s\'";
  }
  else {
    if (nVar1 == NOT_FOUND_ERROR) {
      internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find config item for \'%s\'",key,in_R8,
                      in_R9,uVar2);
      return NOT_FOUND_ERROR;
    }
    fmt = "Failed to find valid color value for config item \'%s\'";
  }
  internal_logger(natwm_logger,LEVEL_ERROR,fmt,key,in_R8,in_R9,uVar2);
  return nVar1;
}

Assistant:

enum natwm_error color_value_from_config(const struct map *map, const char *key,
                                         struct color_value **result)
{
        const char *string = NULL;
        enum natwm_error err = config_find_string(map, key, &string);

        if (err != NO_ERROR) {
                if (err == NOT_FOUND_ERROR) {
                        LOG_ERROR(natwm_logger, "Failed to find config item for '%s'", key);
                } else {
                        LOG_ERROR(natwm_logger,
                                  "Failed to find valid color value for config "
                                  "item '%s'",
                                  key);
                }

                return err;
        }

        struct color_value *value = NULL;

        err = color_value_from_string(string, &value);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Failed to retrieve color value from '%s'", key);

                return err;
        }

        *result = value;

        return NO_ERROR;
}